

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O2

bool __thiscall
Assimp::PLY::DOM::ParseElementInstanceListsBinary
          (DOM *this,IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
          char **pCur,uint *bufferSize,PLYImporter *loader,bool p_bBE)

{
  Logger *pLVar1;
  Element *pcElement;
  ElementInstanceList *p_pcOut;
  pointer this_00;
  PLYImporter *loader_00;
  
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"PLY::DOM::ParseElementInstanceListsBinary() begin");
  std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>::
  resize(&this->alElementData,
         ((long)(this->alElements).
                super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->alElements).
               super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>.
               _M_impl.super__Vector_impl_data._M_start) / 0x48);
  this_00 = (this->alElementData).
            super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (pcElement = (this->alElements).
                   super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      pcElement !=
      (this->alElements).
      super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl.
      super__Vector_impl_data._M_finish; pcElement = pcElement + 1) {
    if (pcElement->eSemantic < EEST_Edge) {
      p_pcOut = (ElementInstanceList *)0x0;
      loader_00 = loader;
    }
    else {
      std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>::
      resize(&this_00->alInstances,(ulong)pcElement->NumOccur);
      loader_00 = (PLYImporter *)0x0;
      p_pcOut = this_00;
    }
    ElementInstanceList::ParseInstanceListBinary
              (streamBuffer,buffer,pCur,bufferSize,pcElement,p_pcOut,loader_00,p_bBE);
    this_00 = this_00 + 1;
  }
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"PLY::DOM::ParseElementInstanceListsBinary() succeeded");
  return true;
}

Assistant:

bool PLY::DOM::ParseElementInstanceListsBinary(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer,
    const char* &pCur,
    unsigned int &bufferSize,
    PLYImporter* loader,
    bool p_bBE)
{
    ASSIMP_LOG_DEBUG("PLY::DOM::ParseElementInstanceListsBinary() begin");
  alElementData.resize(alElements.size());

  std::vector<PLY::Element>::const_iterator i = alElements.begin();
  std::vector<PLY::ElementInstanceList>::iterator a = alElementData.begin();

  // parse all element instances
  for (; i != alElements.end(); ++i, ++a)
  {
    if ((*i).eSemantic == EEST_Vertex || (*i).eSemantic == EEST_Face || (*i).eSemantic == EEST_TriStrip)
    {
      PLY::ElementInstanceList::ParseInstanceListBinary(streamBuffer, buffer, pCur, bufferSize, &(*i), NULL, loader, p_bBE);
    }
    else
    {
      (*a).alInstances.resize((*i).NumOccur);
      PLY::ElementInstanceList::ParseInstanceListBinary(streamBuffer, buffer, pCur, bufferSize, &(*i), &(*a), NULL, p_bBE);
    }
  }

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseElementInstanceListsBinary() succeeded");
  return true;
}